

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

OptBuilder __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::operator[]
          (CommandLine<Catch::ConfigData> *this,string *optName)

{
  string *in_RDX;
  Arg local_d0;
  
  Arg::Arg(&local_d0);
  std::
  vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
  ::emplace_back<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>
            ((vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
              *)&optName->_M_string_length,&local_d0);
  Arg::~Arg(&local_d0);
  addOptName((Arg *)((optName->field_2)._M_allocated_capacity - 0xa8),in_RDX);
  (this->m_boundProcessName).functionObj =
       (IArgFunction<Catch::ConfigData> *)((optName->field_2)._M_allocated_capacity - 0xa8);
  return (OptBuilder)(ArgBuilder)this;
}

Assistant:

OptBuilder operator[]( std::string const& optName ) {
            m_options.push_back( Arg() );
            addOptName( m_options.back(), optName );
            OptBuilder builder( &m_options.back() );
            return builder;
        }